

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTexture2LookupTestCase::init(SparseTexture2LookupTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  set<int,_std::less<int>,_std::allocator<int>_> *this_01;
  int extraout_EAX;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_02;
  FunctionToken f;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  FunctionToken local_3f8;
  FunctionToken local_388;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_388.name._M_dataplus._M_p._0_4_ = 0x9100;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_388);
  local_388.name._M_dataplus._M_p._0_4_ = 0x9102;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_388);
  local_388.name._M_dataplus._M_p._0_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mSupportedInternalFormats,(int *)&local_388);
  local_388.name._M_dataplus._M_p = (pointer)&local_388.name.field_2;
  local_388.name._M_string_length = 0;
  local_388.name.field_2._M_local_buf[0] = '\0';
  local_388.arguments._M_dataplus._M_p = (pointer)&local_388.arguments.field_2;
  local_388.arguments._M_string_length = 0;
  local_388.arguments.field_2._M_local_buf[0] = '\0';
  local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_388.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"sparseTextureARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,glcts::fixed_sample_locations_values + 1,&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_38,&local_58);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = &local_388.allowedTargets;
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  this_02 = &this->mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"sparseTextureLodARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,", <LOD>",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_78,&local_98);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"sparseTextureOffsetARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,", <OFFSET_TYPE><OFFSET_DIM>(0)",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_b8,&local_d8);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"sparseTexelFetchARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"<LOD_DEF>",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_f8,&local_118);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9100;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9102;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"sparseTexelFetchOffsetARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_138,&local_158);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"sparseTextureLodOffsetARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_178,&local_198);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"sparseTextureGradARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)",
             &local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_1b8,&local_1d8);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"sparseTextureGradOffsetARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)"
             ,&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_1f8,&local_218);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"sparseTextureGatherARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"<REFZ_DEF>",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_238,&local_258);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"sparseTextureGatherOffsetARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_278,&local_298);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"sparseTextureGatherOffsetsARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"<REFZ_DEF>, offsetsArray",&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_2b8,&local_2d8);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"sparseImageLoadARB",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,glcts::fixed_sample_locations_values + 1,&local_3fa);
  FunctionToken::FunctionToken(&local_3f8,&local_2f8,&local_318);
  FunctionToken::operator=(&local_388,&local_3f8);
  FunctionToken::~FunctionToken(&local_3f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9100;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  local_3f8.name._M_dataplus._M_p._0_4_ = 0x9102;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_3f8);
  FunctionToken::~FunctionToken(&local_388);
  return extraout_EAX;
}

Assistant:

void SparseTexture2LookupTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetARB", ", <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchARB", "<LOD_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchOffsetARB", "<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodOffsetARB", ", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradOffsetARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherARB", "<REFZ_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetARB", "<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetsARB", "<REFZ_DEF>, offsetsArray");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseImageLoadARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	//mFunctions.push_back(f);
}